

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixRandomness(sqlite3_vfs *NotUsed,int nBuf,char *zBuf)

{
  uint h;
  int iVar1;
  time_t in_RAX;
  int *piVar2;
  time_t t;
  
  t = in_RAX;
  memset(zBuf,0,(long)nBuf);
  randomnessPid = getpid();
  h = robust_open("/dev/urandom",0,0);
  if ((int)h < 0) {
    time(&t);
    *(time_t *)zBuf = t;
    *(pid_t *)(zBuf + 8) = randomnessPid;
    nBuf = 0xc;
  }
  else {
    do {
      iVar1 = (*aSyscall[8].pCurrent)((ulong)h,zBuf,(long)nBuf);
      if (-1 < iVar1) break;
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
    robust_close((unixFile *)0x0,h,0xa499);
  }
  return nBuf;
}

Assistant:

static int unixRandomness(sqlite3_vfs *NotUsed, int nBuf, char *zBuf){
  UNUSED_PARAMETER(NotUsed);
  assert((size_t)nBuf>=(sizeof(time_t)+sizeof(int)));

  /* We have to initialize zBuf to prevent valgrind from reporting
  ** errors.  The reports issued by valgrind are incorrect - we would
  ** prefer that the randomness be increased by making use of the
  ** uninitialized space in zBuf - but valgrind errors tend to worry
  ** some users.  Rather than argue, it seems easier just to initialize
  ** the whole array and silence valgrind, even if that means less randomness
  ** in the random seed.
  **
  ** When testing, initializing zBuf[] to zero is all we do.  That means
  ** that we always use the same random number sequence.  This makes the
  ** tests repeatable.
  */
  memset(zBuf, 0, nBuf);
  randomnessPid = osGetpid(0);
#if !defined(SQLITE_TEST) && !defined(SQLITE_OMIT_RANDOMNESS)
  {
    int fd, got;
    fd = robust_open("/dev/urandom", O_RDONLY, 0);
    if( fd<0 ){
      time_t t;
      time(&t);
      memcpy(zBuf, &t, sizeof(t));
      memcpy(&zBuf[sizeof(t)], &randomnessPid, sizeof(randomnessPid));
      assert( sizeof(t)+sizeof(randomnessPid)<=(size_t)nBuf );
      nBuf = sizeof(t) + sizeof(randomnessPid);
    }else{
      do{ got = osRead(fd, zBuf, nBuf); }while( got<0 && errno==EINTR );
      robust_close(0, fd, __LINE__);
    }
  }
#endif
  return nBuf;
}